

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_csv_relation.cpp
# Opt level: O0

void __thiscall
duckdb::WriteCSVRelation::WriteCSVRelation
          (WriteCSVRelation *this,shared_ptr<duckdb::Relation,_true> *child_p,string *csv_file_p,
          case_insensitive_map_t<vector<Value>_> *options_p)

{
  Relation *in_RDX;
  shared_ptr<duckdb::ClientContextWrapper,_true> *in_RSI;
  undefined8 *in_RDI;
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>_>
  *in_stack_ffffffffffffff48;
  shared_ptr<duckdb::Relation,_true> *in_stack_ffffffffffffff50;
  Relation *this_00;
  string *in_stack_ffffffffffffff68;
  RelationType type;
  shared_ptr<duckdb::ClientContextWrapper,_true> *context;
  allocator local_41;
  string local_40 [64];
  
  context = in_RSI;
  shared_ptr<duckdb::Relation,_true>::operator->(in_stack_ffffffffffffff50);
  type = (RelationType)((ulong)in_RSI >> 0x38);
  ::std::allocator<char>::allocator();
  ::std::__cxx11::string::string(local_40,anon_var_dwarf_3eb64fd + 9,&local_41);
  Relation::Relation(in_RDX,context,type,in_stack_ffffffffffffff68);
  ::std::__cxx11::string::~string(local_40);
  ::std::allocator<char>::~allocator((allocator<char> *)&local_41);
  *in_RDI = &PTR__WriteCSVRelation_035335b8;
  shared_ptr<duckdb::Relation,_true>::shared_ptr
            (in_stack_ffffffffffffff50,
             (shared_ptr<duckdb::Relation,_true> *)in_stack_ffffffffffffff48);
  this_00 = (Relation *)(in_RDI + 0xf);
  ::std::__cxx11::string::string((string *)this_00,(string *)in_RDX);
  vector<duckdb::ColumnDefinition,_true>::vector
            ((vector<duckdb::ColumnDefinition,_true> *)0x19629ea);
  ::std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>,_duckdb::CaseInsensitiveStringHashFunction,_duckdb::CaseInsensitiveStringEquality,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::vector<duckdb::Value,_true>_>_>_>
                   *)this_00,in_stack_ffffffffffffff48);
  Relation::TryBindRelation
            (this_00,(vector<duckdb::ColumnDefinition,_true> *)in_stack_ffffffffffffff48);
  return;
}

Assistant:

WriteCSVRelation::WriteCSVRelation(shared_ptr<Relation> child_p, string csv_file_p,
                                   case_insensitive_map_t<vector<Value>> options_p)
    : Relation(child_p->context, RelationType::WRITE_CSV_RELATION), child(std::move(child_p)),
      csv_file(std::move(csv_file_p)), options(std::move(options_p)) {
	TryBindRelation(columns);
}